

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmSourcesWithOutput * __thiscall
cmLocalGenerator::GetSourcesWithOutput
          (cmSourcesWithOutput *__return_storage_ptr__,cmLocalGenerator *this,string *name)

{
  undefined7 uVar1;
  bool bVar2;
  cmTarget *pcVar3;
  cmSourceFile *pcVar4;
  pointer pvVar5;
  cmSourcesWithOutput *sources;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  local_20;
  const_iterator o;
  string *name_local;
  cmLocalGenerator *this_local;
  
  o.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
               )name;
  bVar2 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar2) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>_>_>
         ::find(&this->OutputToSource,
                o.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                ._M_cur);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>_>_>
         ::end(&this->OutputToSource);
    bVar2 = std::__detail::operator!=(&local_20,&local_28);
    if (bVar2) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_false,_true>
                             *)&local_20);
      __return_storage_ptr__->Target = (pvVar5->second).Sources.Target;
      __return_storage_ptr__->Source = (pvVar5->second).Sources.Source;
      uVar1 = *(undefined7 *)&(pvVar5->second).Sources.field_0x11;
      __return_storage_ptr__->SourceIsByproduct = (pvVar5->second).Sources.SourceIsByproduct;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar1;
    }
    else {
      __return_storage_ptr__->Target = (cmTarget *)0x0;
      __return_storage_ptr__->Source = (cmSourceFile *)0x0;
      __return_storage_ptr__->SourceIsByproduct = false;
    }
  }
  else {
    cmSourcesWithOutput::cmSourcesWithOutput(__return_storage_ptr__);
    pcVar3 = LinearGetTargetWithOutput
                       (this,(string *)
                             o.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                             ._M_cur);
    __return_storage_ptr__->Target = pcVar3;
    pcVar4 = LinearGetSourceFileWithOutput
                       (this,(string *)
                             o.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                             ._M_cur,OutputOrByproduct,&__return_storage_ptr__->SourceIsByproduct);
    __return_storage_ptr__->Source = pcVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

cmSourcesWithOutput cmLocalGenerator::GetSourcesWithOutput(
  const std::string& name) const
{
  // Linear search?  Also see GetSourceFileWithOutput for detail.
  if (!cmSystemTools::FileIsFullPath(name)) {
    cmSourcesWithOutput sources;
    sources.Target = this->LinearGetTargetWithOutput(name);
    sources.Source = this->LinearGetSourceFileWithOutput(
      name, cmSourceOutputKind::OutputOrByproduct, sources.SourceIsByproduct);
    return sources;
  }
  // Otherwise we use an efficient lookup map.
  auto o = this->OutputToSource.find(name);
  if (o != this->OutputToSource.end()) {
    return o->second.Sources;
  }
  return {};
}